

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

Parser * __thiscall xLearn::Reader::CreateParser(Reader *this,char *format_name)

{
  Parser *pPVar1;
  char *in_RSI;
  string *in_stack_ffffffffffffffc0;
  ObjectCreatorRegistry_xLearn_parser_registry *in_stack_ffffffffffffffc8;
  string local_30 [32];
  char *local_10;
  
  local_10 = in_RSI;
  GetRegistry_xLearn_parser_registry();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,local_10,(allocator *)&stack0xffffffffffffffcf);
  pPVar1 = ObjectCreatorRegistry_xLearn_parser_registry::CreateObject
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  return pPVar1;
}

Assistant:

Parser* CreateParser(const char* format_name) {
    return CREATE_PARSER(format_name);
  }